

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O0

clientinfo * server::aiman::findaiclient(clientinfo *exclude)

{
  clientinfo *ci_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  clientinfo **ppcVar4;
  clientinfo *ci;
  clientinfo *pcStack_18;
  int i;
  clientinfo *least;
  clientinfo *exclude_local;
  
  pcStack_18 = (clientinfo *)0x0;
  ci._4_4_ = 0;
  do {
    iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
    if (iVar2 <= ci._4_4_) {
      return pcStack_18;
    }
    ppcVar4 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,ci._4_4_);
    ci_00 = *ppcVar4;
    bVar1 = validaiclient(ci_00);
    if ((bVar1) && (ci_00 != exclude)) {
      if (pcStack_18 != (clientinfo *)0x0) {
        iVar2 = vector<server::clientinfo_*>::length(&ci_00->bots);
        iVar3 = vector<server::clientinfo_*>::length(&pcStack_18->bots);
        if (iVar3 <= iVar2) goto LAB_00165c74;
      }
      pcStack_18 = ci_00;
    }
LAB_00165c74:
    ci._4_4_ = ci._4_4_ + 1;
  } while( true );
}

Assistant:

clientinfo *findaiclient(clientinfo *exclude = NULL)
    {
        clientinfo *least = NULL;
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(!validaiclient(ci) || ci==exclude) continue;
            if(!least || ci->bots.length() < least->bots.length()) least = ci;
        }
        return least;
    }